

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O3

void __thiscall kratos::AssignmentTypeVisitor::visit(AssignmentTypeVisitor *this,AssignStmt *stmt)

{
  Generator *pGVar1;
  AssignmentType type;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  undefined1 auVar2 [12];
  Var *local_b8;
  Var *local_b0;
  string local_a8;
  string local_88;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_68;
  size_type sStack_50;
  string local_48;
  allocator_type local_21;
  
  pGVar1 = Stmt::generator_parent(&stmt->super_Stmt);
  if ((pGVar1 == (Generator *)0x0) ||
     (((pGVar1->is_cloned_ == false &&
       ((pGVar1->lib_files_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pGVar1->lib_files_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) && ((pGVar1->is_external_ & 1U) == 0)))) {
    if (stmt->assign_type_ == Undefined) {
      stmt->assign_type_ = this->type_;
    }
    else if ((this->check_type_ == true) && (stmt->assign_type_ != this->type_)) {
      auVar2 = __cxa_allocate_exception(0x10);
      assign_type_to_str_abi_cxx11_(&local_48,(kratos *)(ulong)this->type_,auVar2._8_4_);
      assign_type_to_str_abi_cxx11_(&local_88,(kratos *)(ulong)stmt->assign_type_,type);
      local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_48._M_dataplus._M_p;
      local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)local_48._M_string_length;
      local_68.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_88._M_dataplus._M_p;
      sStack_50 = local_88._M_string_length;
      format_str.size_ = 0xdd;
      format_str.data_ = (char *)0x33;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_68;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_a8,(detail *)"mismatch in assignment type. should be {0}, got {1}",
                 format_str,args);
      local_b8 = stmt->left_;
      local_b0 = stmt->right_;
      __l._M_len = 2;
      __l._M_array = (iterator)&local_b8;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_68,__l,&local_21);
      VarException::VarException(auVar2._0_8_,&local_a8,&local_68);
      __cxa_throw(auVar2._0_8_,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void visit(AssignStmt* stmt) override {
        auto* parent = stmt->generator_parent();
        if (parent && (parent->is_cloned() || parent->external())) return;
        if (stmt->assign_type() == AssignmentType::Undefined) {
            stmt->set_assign_type(type_);
        } else if (check_type_ && stmt->assign_type() != type_) {
            throw VarException(
                ::format("mismatch in assignment type. should be {0}, got {1}",
                         assign_type_to_str(type_), assign_type_to_str(stmt->assign_type())),
                {stmt->left(), stmt->right()});
        }
    }